

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::IntegerFunctionCase::iterate(IntegerFunctionCase *this)

{
  allocator<unsigned_int> *this_00;
  allocator<void_*> *this_01;
  ShaderExecutor *pSVar1;
  value_type pvVar2;
  int iVar3;
  uint uVar4;
  const_reference ppvVar5;
  const_reference ppvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference ppvVar9;
  reference ppvVar10;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  reference pvVar13;
  char *description;
  int local_a94;
  MessageBuilder local_a90;
  allocator<char> local_909;
  string local_908 [32];
  VarValue local_8e8;
  MessageBuilder local_8d8;
  int local_754;
  undefined1 local_750 [4];
  int outNdx_1;
  VarValue local_5d0;
  MessageBuilder local_5c0;
  int local_43c;
  undefined1 local_438 [4];
  int inNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  MessageBuilder local_298;
  int local_114;
  int local_110;
  int outNdx;
  int inNdx;
  int valNdx;
  int numFailed;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  undefined1 local_e0 [8];
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  allocator<unsigned_int> local_31;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  int numOutputScalars;
  int numInputScalars;
  IntegerFunctionCase *this_local;
  
  inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = computeTotalScalarSize(&(this->m_spec).inputs);
  inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = computeTotalScalarSize(&(this->m_spec).outputs);
  iVar3 = inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ * this->m_numValues;
  std::allocator<unsigned_int>::allocator(&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,(long)iVar3,&local_31);
  std::allocator<unsigned_int>::~allocator(&local_31);
  iVar3 = (int)inputData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage * this->m_numValues;
  this_00 = (allocator<unsigned_int> *)
            ((long)&inputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,(long)iVar3,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&inputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&(this->m_spec).inputs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,this->m_numValues);
  getInputOutputPointers
            ((vector<void_*,_std::allocator<void_*>_> *)
             &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&(this->m_spec).outputs,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,this->m_numValues);
  uVar4 = this->m_numValues;
  ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)uVar4,ppvVar5);
  (*this->m_executor->_vptr_ShaderExecutor[5])();
  pSVar1 = this->m_executor;
  uVar4 = this->m_numValues;
  ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*pSVar1->_vptr_ShaderExecutor[6])(pSVar1,(ulong)uVar4,ppvVar5,ppvVar6);
  getScalarSizes((vector<int,_std::allocator<int>_> *)
                 &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&(this->m_spec).inputs);
  getScalarSizes((vector<int,_std::allocator<int>_> *)
                 &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&(this->m_spec).outputs);
  sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  this_01 = (allocator<void_*> *)
            ((long)&curOutputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<void_*>::allocator(this_01);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_e0,sVar7,this_01);
  std::allocator<void_*>::~allocator
            ((allocator<void_*> *)
             ((long)&curOutputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::allocator<void_*>::allocator((allocator<void_*> *)((long)&valNdx + 3));
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,sVar7,
             (allocator<void_*> *)((long)&valNdx + 3));
  std::allocator<void_*>::~allocator((allocator<void_*> *)((long)&valNdx + 3));
  inNdx = 0;
  for (outNdx = 0; outNdx < this->m_numValues; outNdx = outNdx + 1) {
    local_110 = 0;
    while( true ) {
      iVar3 = local_110;
      sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_e0);
      if ((int)sVar7 <= iVar3) break;
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)
                           &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_110);
      pvVar2 = *ppvVar5;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_110);
      iVar3 = *pvVar8 * outNdx;
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_e0,(long)local_110);
      *ppvVar9 = (value_type)((long)pvVar2 + (long)iVar3 * 4);
      local_110 = local_110 + 1;
    }
    local_114 = 0;
    while( true ) {
      iVar3 = local_114;
      sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
      if ((int)sVar7 <= iVar3) break;
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)
                           &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_114);
      pvVar2 = *ppvVar5;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_114);
      iVar3 = *pvVar8 * outNdx;
      ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,(long)local_114);
      *ppvVar9 = (value_type)((long)pvVar2 + (long)iVar3 * 4);
      local_114 = local_114 + 1;
    }
    ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_e0,0);
    ppvVar10 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                         ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,0);
    uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (this,ppvVar9,ppvVar10);
    if ((uVar4 & 1) == 0) {
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_298,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_298,(char (*) [36])"ERROR: comparison failed for value ");
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&outNdx);
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [5])0x2b489da);
      std::__cxx11::ostringstream::str();
      pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_2b8);
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_2b8);
      tcu::MessageBuilder::~MessageBuilder(&local_298);
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_438,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_438,(char (*) [10])"  inputs:");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_438);
      local_43c = 0;
      while( true ) {
        iVar3 = local_43c;
        sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                          ((vector<void_*,_std::allocator<void_*>_> *)local_e0);
        if ((int)sVar7 <= iVar3) break;
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5c0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_5c0,(char (*) [5])0x2bece84);
        pvVar13 = std::
                  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ::operator[](&(this->m_spec).inputs,(long)local_43c);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pvVar13->name);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x2bdb312);
        pvVar13 = std::
                  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ::operator[](&(this->m_spec).inputs,(long)local_43c);
        ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)local_e0,(long)local_43c);
        anon_unknown_3::VarValue::VarValue(&local_5d0,&pvVar13->varType,*ppvVar9);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_5d0);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5c0);
        local_43c = local_43c + 1;
      }
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_750,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_750,(char (*) [11])"  outputs:");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_750);
      local_754 = 0;
      while( true ) {
        iVar3 = local_754;
        sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                          ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
        if ((int)sVar7 <= iVar3) break;
        pTVar11 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_8d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_8d8,(char (*) [5])0x2bece84);
        pvVar13 = std::
                  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ::operator[](&(this->m_spec).outputs,(long)local_754);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pvVar13->name);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x2bdb312);
        pvVar13 = std::
                  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ::operator[](&(this->m_spec).outputs,(long)local_754);
        ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed,(long)local_754);
        anon_unknown_3::VarValue::VarValue(&local_8e8,&pvVar13->varType,*ppvVar9);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_8e8);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8d8);
        local_754 = local_754 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_908,"",&local_909);
      std::__cxx11::ostringstream::str((string *)&this->m_failMsg);
      std::__cxx11::string::~string(local_908);
      std::allocator<char>::~allocator(&local_909);
      std::ios::clear((this->m_failMsg).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3] +
                      (long)&(this->m_failMsg).super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream,0);
      inNdx = inNdx + 1;
    }
  }
  pTVar11 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_a90,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  local_a94 = this->m_numValues - inNdx;
  pMVar12 = tcu::MessageBuilder::operator<<(&local_a90,&local_a94);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [4])0x2b88b0c);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&this->m_numValues);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a90);
  description = "Result comparison failed";
  if (inNdx == 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(inNdx != 0),
             description);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)&numFailed);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_e0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &curInputPtr.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &outScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &inScalarSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputPointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return STOP;
}

Assistant:

IntegerFunctionCase::IterateResult IntegerFunctionCase::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->useProgram();
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Result comparison failed");
	}

	return STOP;
}